

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall QItemDelegate::setEditorData(QItemDelegate *this,QWidget *editor,QModelIndex *index)

{
  char *pcVar1;
  QMetaType QVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_a8;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_48,index,2);
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d._0_4_ = 0xaaaaaaaa;
  local_a8.d._4_4_ = 0xaaaaaaaa;
  local_a8.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.ptr._4_4_ = 0xaaaaaaaa;
  (*(code *)**(undefined8 **)editor)(editor);
  QMetaObject::userProperty();
  pcVar1 = (char *)QMetaProperty::name();
  QByteArray::QByteArray((QByteArray *)&local_a8,pcVar1,-1);
  if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
    if (puStack_30 < (undefined1 *)0x4) {
      QObject::property((char *)&local_88);
      QVar2.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      ::QVariant::QVariant(&local_68,QVar2,(void *)0x0);
      ::QVariant::operator=((QVariant *)&local_48,&local_68);
      ::QVariant::~QVariant(&local_68);
      ::QVariant::~QVariant(&local_88);
    }
    pcVar1 = (char *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = (char *)&QByteArray::_empty;
    }
    QObject::setProperty(&editor->super_QObject,pcVar1,(QVariant *)&local_48);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::setEditorData(QWidget *editor, const QModelIndex &index) const
{
    QVariant v = index.data(Qt::EditRole);
    QByteArray n = editor->metaObject()->userProperty().name();

    if (!n.isEmpty()) {
        if (!v.isValid())
            v = QVariant(editor->property(n).metaType());
        editor->setProperty(n, v);
    }
}